

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleMessageBox::text(QString *__return_storage_ptr__,QAccessibleMessageBox *this,Text t)

{
  Data *pDVar1;
  char16_t *pcVar2;
  QWidget *pQVar3;
  QTypedArrayData<char16_t> *tmp;
  char16_t *tmp_1;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t == Help) {
    pQVar3 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QMessageBox::informativeText(&local_58,(QMessageBox *)pQVar3);
LAB_005260ef:
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
  }
  else {
    if (t == Value) {
      pQVar3 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
      QMessageBox::text(&local_58,(QMessageBox *)pQVar3);
      goto LAB_005260ef;
    }
    if (t == Name) {
      QAccessibleWidget::text(&local_58,&this->super_QAccessibleWidget,Name);
      pcVar2 = local_58.d.ptr;
      pDVar1 = local_58.d.d;
      (__return_storage_ptr__->d).d = local_58.d.d;
      local_58.d.d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      local_58.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = local_58.d.size;
      if (local_58.d.size == 0) {
        pQVar3 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
        QMessageBox::text(&local_58,(QMessageBox *)pQVar3);
        (__return_storage_ptr__->d).d = local_58.d.d;
        (__return_storage_ptr__->d).ptr = local_58.d.ptr;
        (__return_storage_ptr__->d).size = local_58.d.size;
        local_58.d.size = 0;
        local_58.d.d = pDVar1;
        local_58.d.ptr = pcVar2;
        if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
          }
        }
      }
      goto LAB_00526116;
    }
    QAccessibleWidget::text(&local_58,&this->super_QAccessibleWidget,t);
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
  }
  (__return_storage_ptr__->d).size = local_58.d.size;
LAB_00526116:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMessageBox::text(QAccessible::Text t) const
{
    QString str;

    switch (t) {
    case QAccessible::Name:
        str = QAccessibleWidget::text(t);
        if (str.isEmpty()) // implies no title text is set
            str = messageBox()->text();
        break;
    case QAccessible::Value:
        str = messageBox()->text();
        break;
    case QAccessible::Help:
        str = messageBox()->informativeText();
        break;
    default:
        str = QAccessibleWidget::text(t);
        break;
    }

    return str;
}